

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O0

void boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  is_any_ofF<char> *in_RSI;
  is_any_ofF<char> *in_RDI;
  is_any_ofF<char> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  is_any_ofF<char> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  is_any_ofF<char> *in_stack_ffffffffffffff90;
  is_any_ofF<char> *this;
  is_any_ofF<char> local_50 [3];
  
  detail::is_any_ofF<char>::is_any_ofF(in_RDI,in_RSI);
  trim_right_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_00000020,in_stack_00000018);
  detail::is_any_ofF<char>::~is_any_ofF(in_stack_ffffffffffffff90);
  this = local_50;
  detail::is_any_ofF<char>::is_any_ofF(in_RDI,in_RSI);
  trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_00000010,in_stack_00000008);
  detail::is_any_ofF<char>::~is_any_ofF(this);
  return;
}

Assistant:

inline void trim_if(SequenceT& Input, PredicateT IsSpace)
        {
            ::boost::algorithm::trim_right_if( Input, IsSpace );
            ::boost::algorithm::trim_left_if( Input, IsSpace );
        }